

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

int luaB_pairs(lua_State *L)

{
  StkId pTVar1;
  
  luaL_checktype(L,1,5);
  lua_pushvalue(L,-0x2713);
  lua_pushvalue(L,1);
  pTVar1 = L->top;
  pTVar1->tt = 0;
  L->top = pTVar1 + 1;
  return 3;
}

Assistant:

static int luaB_pairs(lua_State*L){
luaL_checktype(L,1,5);
lua_pushvalue(L,lua_upvalueindex(1));
lua_pushvalue(L,1);
lua_pushnil(L);
return 3;
}